

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Vec_Vec_t *
Saig_ManCexMinCollectReason
          (Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis,Vec_Vec_t *vFramePPs,int fPiReason)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  uint uVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  Vec_Int_t *vRoots;
  int *piVar9;
  Vec_Int_t *vLeaves;
  Aig_Obj_t *pObj;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  
  uVar1 = pCex->iFrame;
  uVar10 = (ulong)uVar1;
  uVar13 = uVar1 + 1;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar10) {
    uVar5 = uVar13;
  }
  pVVar6->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar5 << 3);
  }
  pVVar6->pArray = ppvVar7;
  if (-1 < (int)uVar1) {
    uVar11 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      ppvVar7[uVar11] = pvVar8;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  pVVar6->nSize = uVar13;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vRoots->pArray = piVar9;
  uVar11 = uVar10;
  if (-1 < (int)uVar1) {
    do {
      Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,(int)uVar11,vRoots);
      if (uVar11 == (uint)pCex->iFrame) {
        vLeaves = (Vec_Int_t *)0x0;
      }
      else {
        if (vFrameCis->nSize <= (int)uVar11 + 1) {
LAB_00525c42:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        vLeaves = (Vec_Int_t *)vFrameCis->pArray[uVar11 + 1];
      }
      Saig_ManCexMinGetCos(pAig,pCex,vLeaves,vRoots);
      Aig_ManIncrementTravId(pAig);
      iVar2 = vRoots->nSize;
      if (0 < (long)iVar2) {
        piVar9 = vRoots->pArray;
        lVar12 = 0;
        do {
          pVVar3 = pAig->vObjs;
          if (pVVar3 == (Vec_Ptr_t *)0x0) {
            pObj = (Aig_Obj_t *)0x0;
          }
          else {
            uVar1 = piVar9[lVar12];
            if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pObj = (Aig_Obj_t *)pVVar3->pArray[uVar1];
          }
          if ((long)uVar10 < (long)uVar11) goto LAB_00525c42;
          Saig_ManCexMinCollectReason_rec(pAig,pObj,(Vec_Int_t *)ppvVar7[uVar11],fPiReason);
          lVar12 = lVar12 + 1;
        } while (iVar2 != lVar12);
      }
      bVar4 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
    piVar9 = vRoots->pArray;
  }
  if (piVar9 != (int *)0x0) {
    free(piVar9);
  }
  free(vRoots);
  return pVVar6;
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectReason( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis, Vec_Vec_t * vFramePPs, int fPiReason )
{
    Vec_Vec_t * vFrameReas;
    Vec_Int_t * vRoots, * vLeaves;
    Aig_Obj_t * pObj;
    int i, f;
    // select reason for the property to fail
    vFrameReas = Vec_VecStart( pCex->iFrame+1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // set phase and polarity
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
        // create roots
        vLeaves = (f == pCex->iFrame) ? NULL : Vec_VecEntryInt(vFrameCis, f+1);
        Saig_ManCexMinGetCos( pAig, pCex, vLeaves, vRoots );
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManCexMinCollectReason_rec( pAig, pObj, Vec_VecEntryInt(vFrameReas, f), fPiReason );
//printf( "%d(%d) ", Vec_VecLevelSize(vFrameCis, f), Vec_VecLevelSize(vFrameReas, f) ); 
    }
//printf( "\n" );
    Vec_IntFree( vRoots );
    return vFrameReas;
}